

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall Statements::print(Statements *this)

{
  pointer ppSVar1;
  Statement *pSVar2;
  vector<Statement_*,_std::allocator<Statement_*>_> *__range1;
  pointer ppSVar3;
  int i;
  int iVar4;
  
  ppSVar1 = (this->_statements).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppSVar3 = (this->_statements).super__Vector_base<Statement_*,_std::allocator<Statement_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar1; ppSVar3 = ppSVar3 + 1
      ) {
    pSVar2 = *ppSVar3;
    std::operator<<((ostream *)&std::cout,"\n");
    if (pSVar2 != (Statement *)0x0) {
      iVar4 = 0;
      while( true ) {
        if (this->_indState <= iVar4) break;
        std::operator<<((ostream *)&std::cout," ");
        iVar4 = iVar4 + 1;
      }
      pSVar2->indentState = this->_indState;
      (**pSVar2->_vptr_Statement)(pSVar2);
    }
  }
  return;
}

Assistant:

void Statements::print() {
    //std::cout << "Printing Statements...\n";

    for (auto s: _statements) {
        std::cout << "\n";
        if(s == NULL) continue;
        for (int i = 0; i < _indState; i++)
            std::cout << " "; // exact spaces for indent
        s->indentState = _indState;
        s->print();
    }

}